

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O3

void __thiscall dlib::thread_pool_implementation::shutdown_pool(thread_pool_implementation *this)

{
  pointer ptVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  pointer ptVar5;
  task_state_type *task;
  task_state_type *this_00;
  thread *t;
  pointer ptVar6;
  long lVar7;
  auto_mutex M;
  auto_mutex local_30;
  
  local_30.m = &this->m;
  local_30.r = (rmutex *)0x0;
  local_30.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_30.m);
  uVar3 = (this->tasks).array_size;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      if ((this->tasks).array_elements[uVar4].task_id == 0) {
        uVar4 = uVar4 + 1;
      }
      else {
        pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                          (pthread_mutex_t *)(this->task_done_signaler).associated_mutex);
        uVar3 = (this->tasks).array_size;
        uVar4 = 0;
      }
    } while (uVar4 < uVar3);
  }
  this->we_are_destructing = true;
  pthread_cond_broadcast((pthread_cond_t *)&(this->task_ready_signaler).cond);
  auto_mutex::unlock(&local_30);
  ptVar6 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar6 != ptVar1) {
    do {
      std::thread::join();
      ptVar6 = ptVar6 + 1;
    } while (ptVar6 != ptVar1);
    ptVar6 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar5 = ptVar6;
    if (ptVar1 != ptVar6) {
      do {
        if ((ptVar5->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar5 = ptVar5 + 1;
      } while (ptVar5 != ptVar1);
      (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar6;
    }
  }
  sVar2 = (this->tasks).array_size;
  if (sVar2 != 0) {
    this_00 = (this->tasks).array_elements;
    lVar7 = sVar2 * 0x1a0;
    do {
      task_state_type::propagate_exception(this_00);
      this_00 = this_00 + 1;
      lVar7 = lVar7 + -0x1a0;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void thread_pool_implementation::
    shutdown_pool (
    )
    {
        {
            auto_mutex M(m);
            
            // first wait for all pending tasks to finish
            bool found_task = true;
            while (found_task)
            {
                found_task = false;
                for (unsigned long i = 0; i < tasks.size(); ++i)
                {
                    // If task bucket i has a task that is currently supposed to be processed
                    if (tasks[i].is_empty() == false)
                    {
                        found_task = true;
                        break;
                    }
                }

                if (found_task)
                    task_done_signaler.wait();
            }

            // now tell the threads to kill themselves
            we_are_destructing = true;
            task_ready_signaler.broadcast();
        }

        // wait for all threads to terminate
        for (auto& t : threads)
            t.join();
        threads.clear();

        // Throw any unhandled exceptions.  Since shutdown_pool() is only called in the
        // destructor this will kill the program.
        for (auto&& task : tasks)
            task.propagate_exception();
    }